

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::level_formatter<spdlog::details::scoped_padder>::format
          (level_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  ulong uVar1;
  scoped_padder p;
  scoped_padder local_40;
  
  uVar1 = (ulong)msg->level;
  scoped_padder::scoped_padder
            (&local_40,(&DAT_00327a98)[uVar1 * 2],&(this->super_flag_formatter).padinfo_,dest);
  ::fmt::v7::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,(char *)(&level::level_string_views)[uVar1 * 2],
             (char *)(&level::level_string_views)[uVar1 * 2] + (&DAT_00327a98)[uVar1 * 2]);
  scoped_padder::~scoped_padder(&local_40);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        string_view_t &level_name = level::to_string_view(msg.level);
        ScopedPadder p(level_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }